

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_maximal_dimension<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,true>>>
               (Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>
                *m)

{
  undefined8 uVar1;
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>
  *pMVar2;
  bool bVar3;
  int iVar4;
  lazy_ostream *plVar5;
  undefined4 local_1a0;
  Dimension local_19c;
  basic_cstring<const_char> local_198;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_188;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  int local_140 [8];
  pair<unsigned_int,_unsigned_int> local_120;
  pair<unsigned_int,_unsigned_int> pStack_118;
  pair<unsigned_int,_unsigned_int> pStack_110;
  pair<unsigned_int,_unsigned_int> pStack_108;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_100;
  int local_f0 [12];
  pair<unsigned_int,_unsigned_int> local_c0;
  pair<unsigned_int,_unsigned_int> pStack_b8;
  pair<unsigned_int,_unsigned_int> pStack_b0;
  pair<unsigned_int,_unsigned_int> pStack_a8;
  pair<unsigned_int,_unsigned_int> pStack_a0;
  pair<unsigned_int,_unsigned_int> pStack_98;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_90;
  undefined4 local_7c;
  Dimension local_78 [4];
  basic_cstring<const_char> local_68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_58;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>
  *local_10;
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>
  *m_local;
  
  local_10 = m;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0x39f,&local_30);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_58,plVar5,(char (*) [1])0x2d422c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_78[0] = Gudhi::persistence_matrix::
                  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>
                  ::get_max_dimension(local_10);
    local_7c = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_58,&local_68,0x39f,1,2,local_78,"m.get_max_dimension()",&local_7c,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_58);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
    pMVar2 = local_10;
  } while (bVar3);
  local_f0[0xb] = 0;
  local_f0[10] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_c0,local_f0 + 0xb,local_f0 + 10);
  local_f0[9] = 1;
  local_f0[8] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&pStack_b8,local_f0 + 9,local_f0 + 8);
  local_f0[7] = 2;
  local_f0[6] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&pStack_b0,local_f0 + 7,local_f0 + 6);
  local_f0[5] = 3;
  local_f0[4] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&pStack_a8,local_f0 + 5,local_f0 + 4);
  local_f0[3] = 4;
  local_f0[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&pStack_a0,local_f0 + 3,local_f0 + 2);
  local_f0[1] = 5;
  local_f0[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&pStack_98,local_f0 + 1,local_f0);
  local_90._M_array = &local_c0;
  local_90._M_len = 6;
  iVar4 = Gudhi::persistence_matrix::
          Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>
          ::get_null_value<int>();
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,true>>
              *)pMVar2,&local_90,iVar4);
  pMVar2 = local_10;
  local_140[7] = 0;
  local_140[6] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_120,local_140 + 7,local_140 + 6);
  local_140[5] = 1;
  local_140[4] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&pStack_118,local_140 + 5,local_140 + 4);
  local_140[3] = 2;
  local_140[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&pStack_110,local_140 + 3,local_140 + 2);
  local_140[1] = 3;
  local_140[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&pStack_108,local_140 + 1,local_140);
  local_100._M_array = &local_120;
  local_100._M_len = 4;
  iVar4 = Gudhi::persistence_matrix::
          Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>
          ::get_null_value<int>();
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,true>>
              *)pMVar2,&local_100,iVar4);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_160);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_150,0x3a9,&local_160);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_188,plVar5,(char (*) [1])0x2d422c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_19c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>
                ::get_max_dimension(local_10);
    local_1a0 = 5;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_188,&local_198,0x3a9,1,2,&local_19c,"m.get_max_dimension()",&local_1a0,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_188);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  return;
}

Assistant:

void test_maximal_dimension(Matrix& m) {
  BOOST_CHECK_EQUAL(m.get_max_dimension(), 2);

  if constexpr (Matrix::Option_list::is_z2) {
    m.insert_boundary({0, 1, 2, 3, 4, 5});
    m.insert_boundary({0, 1, 2, 3});
  } else {
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}, {4, 1}, {5, 4}});
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}});
  }

  BOOST_CHECK_EQUAL(m.get_max_dimension(), 5);

  if constexpr (Matrix::Option_list::has_vine_update &&
                (Matrix::Option_list::is_of_boundary_type ||
                 (Matrix::Option_list::has_map_column_container && Matrix::Option_list::has_column_pairings))) {
    m.remove_maximal_cell(7);
    BOOST_CHECK_EQUAL(m.get_max_dimension(), 3);
  }
}